

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O2

Try<std::pair<std::error_code,_unsigned_long>_> * __thiscall
async_simple::coro::detail::
LazyAwaiterBase<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_>::awaitResume
          (Try<std::pair<std::error_code,_unsigned_long>_> *__return_storage_ptr__,
          LazyAwaiterBase<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_> *this)

{
  Try<std::pair<std::error_code,_unsigned_long>_> *__rhs;
  Try<std::pair<std::error_code,_unsigned_long>_> r;
  _Variant_storage<false,_std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
  local_30;
  
  __rhs = LazyPromise<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_>::result
                    ((LazyPromise<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_> *)
                     ((long)(this->_handle).__handle_ + 0x10));
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
                     *)&local_30,
                    (_Move_ctor_base<false,_std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
                     *)__rhs);
  (**(code **)((long)(this->_handle).__handle_ + 8))();
  (this->_handle).__handle_ = (void *)0x0;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
                     *)__return_storage_ptr__,
                    (_Move_ctor_base<false,_std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
                     *)&local_30);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_std::pair<std::error_code,_unsigned_long>,_std::__exception_ptr::exception_ptr>
  ::~_Variant_storage(&local_30);
  return __return_storage_ptr__;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }